

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O1

void __thiscall Teleport::SharedMemoryHandle::~SharedMemoryHandle(SharedMemoryHandle *this)

{
  if (this->data != (SharedMemory *)0x0) {
    munmap(this->data,0x2b1240);
    return;
  }
  return;
}

Assistant:

~SharedMemoryHandle()
        {
#if UNITY_WIN

            UnmapViewOfFile(data);
            CloseHandle(hMapFile);

#else

            if (data)
            {
                munmap(data, sizeof(SharedMemory));
            }

#endif
        }